

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

void __thiscall Layout::dump(Layout *this)

{
  LayoutItem *pLVar1;
  bool bVar2;
  ostream *poVar3;
  reference ppLVar4;
  double dVar5;
  LayoutItem *c_2;
  LayoutItem *c_1;
  iterator __end1;
  iterator __begin1;
  list<LayoutItem_*,_std::allocator<LayoutItem_*>_> *__range1;
  LayoutItem *c;
  Layout *this_local;
  
  if (this->m_firstCorner != (LayoutItem *)0x0) {
    pLVar1 = this->m_firstCorner;
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&pLVar1->m_instance);
    poVar3 = std::operator<<(poVar3," : ");
    poVar3 = std::operator<<(poVar3,(string *)&pLVar1->m_cellname);
    poVar3 = std::operator<<(poVar3," ");
    dVar5 = getItemPos(this,pLVar1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
    std::operator<<(poVar3,"\n");
  }
  __end1 = std::__cxx11::list<LayoutItem_*,_std::allocator<LayoutItem_*>_>::begin(&this->m_items);
  c_1 = (LayoutItem *)
        std::__cxx11::list<LayoutItem_*,_std::allocator<LayoutItem_*>_>::end(&this->m_items);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&c_1);
    if (!bVar2) break;
    ppLVar4 = std::_List_iterator<LayoutItem_*>::operator*(&__end1);
    pLVar1 = *ppLVar4;
    if ((pLVar1->m_ltype == TYPE_CELL) || (pLVar1->m_ltype == TYPE_CORNER)) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&pLVar1->m_instance);
      poVar3 = std::operator<<(poVar3," : ");
      poVar3 = std::operator<<(poVar3,(string *)&pLVar1->m_cellname);
      poVar3 = std::operator<<(poVar3," ");
      dVar5 = getItemPos(this,pLVar1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
      std::operator<<(poVar3,"\n");
    }
    std::_List_iterator<LayoutItem_*>::operator++(&__end1);
  }
  if (this->m_lastCorner != (LayoutItem *)0x0) {
    pLVar1 = this->m_lastCorner;
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&pLVar1->m_instance);
    poVar3 = std::operator<<(poVar3," : ");
    poVar3 = std::operator<<(poVar3,(string *)&pLVar1->m_cellname);
    poVar3 = std::operator<<(poVar3," ");
    dVar5 = getItemPos(this,pLVar1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
    std::operator<<(poVar3,"\n");
  }
  return;
}

Assistant:

void Layout::dump()
{
    if (m_firstCorner != nullptr)
    {
        auto c = m_firstCorner;
        std::cout << c->m_instance << " : " << c->m_cellname << " " << getItemPos(c) << "\n";
    }

    for(auto c : m_items)
    {
        if ((c->m_ltype == LayoutItem::TYPE_CELL) || (c->m_ltype == LayoutItem::TYPE_CORNER))
        {
            std::cout << c->m_instance << " : " << c->m_cellname << " " << getItemPos(c) << "\n";
        }
    }

    if (m_lastCorner != nullptr)
    {
        auto c = m_lastCorner;
        std::cout << c->m_instance << " : " << c->m_cellname << " " << getItemPos(c) << "\n";
    }

}